

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O1

void __thiscall fasttext::Autotune::printInfo(Autotune *this,double maxDuration)

{
  double dVar1;
  long lVar2;
  ostream *poVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ClockPrint local_14;
  
  auVar5._0_8_ = (this->elapsed_ * 100.0) / maxDuration;
  auVar5._8_8_ = 0;
  auVar5 = vminsd_avx(ZEXT816(0x4059000000000000),auVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\r",1);
  *(uint *)(std::ios_base::Init::~Init + *(long *)(std::cerr + -0x18)) =
       *(uint *)(std::ios_base::Init::~Init + *(long *)(std::cerr + -0x18)) & 0xfffffefb | 4;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Progress: ",10);
  lVar2 = std::cerr;
  *(undefined8 *)(&std::runtime_error::typeinfo + *(long *)(std::cerr + -0x18)) = 1;
  *(undefined8 *)(std::istream::_M_extract<float> + *(long *)(lVar2 + -0x18)) = 5;
  poVar3 = std::ostream::_M_insert<double>(auVar5._0_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"%",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," Trials: ",9);
  *(undefined8 *)(std::istream::_M_extract<float> + *(long *)(std::cerr + -0x18)) = 4;
  std::ostream::operator<<((ostream *)&std::cerr,this->trials_);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," Best score: ",0xd);
  lVar2 = std::cerr;
  *(undefined8 *)(std::istream::_M_extract<float> + *(long *)(std::cerr + -0x18)) = 9;
  *(undefined8 *)(&std::runtime_error::typeinfo + *(long *)(lVar2 + -0x18)) = 6;
  dVar1 = this->bestScore_;
  if ((dVar1 != -1.0) || (NAN(dVar1))) {
    std::ostream::_M_insert<double>(dVar1);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"unknown",7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ETA: ",6);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = maxDuration - this->elapsed_;
  auVar5 = vmaxsd_avx(ZEXT816(0) << 0x40,auVar4);
  utils::ClockPrint::ClockPrint(&local_14,(int)auVar5._0_8_);
  utils::operator<<((ostream *)&std::cerr,&local_14);
  std::ostream::flush();
  return;
}

Assistant:

void Autotune::printInfo(double maxDuration) {
  double progress = elapsed_ * 100 / maxDuration;
  progress = std::min(progress, 100.0);

  std::cerr << "\r";
  std::cerr << std::fixed;
  std::cerr << "Progress: ";
  std::cerr << std::setprecision(1) << std::setw(5) << progress << "%";
  std::cerr << " Trials: " << std::setw(4) << trials_;
  std::cerr << " Best score: " << std::setw(9) << std::setprecision(6);
  if (bestScore_ == kUnknownBestScore) {
    std::cerr << "unknown";
  } else {
    std::cerr << bestScore_;
  }
  std::cerr << " ETA: "
            << utils::ClockPrint(std::max(maxDuration - elapsed_, 0.0));
  std::cerr << std::flush;
}